

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<int>::AutoFill(TPZMatrix<int> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  TPZBaseMatrix *in_RDI;
  __type_conflict _Var7;
  __type_conflict _Var8;
  int sum;
  int val;
  int64_t j;
  int64_t i;
  char *in_stack_00000178;
  char *in_stack_00000180;
  undefined4 local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  int local_1c;
  
  local_1c = in_ECX;
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xd])(in_RDI,in_RSI,in_RDX);
  for (local_28 = 0; lVar1 = local_28, iVar5 = TPZBaseMatrix::Rows(in_RDI), lVar1 < iVar5;
      local_28 = local_28 + 1) {
    local_38 = 0;
    local_30 = 0;
    if (local_1c != 0) {
      for (; lVar2 = local_28, lVar1 = local_30, local_30 < local_28; local_30 = local_30 + 1) {
        local_3c = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_30,local_28);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar2,lVar1,&local_3c);
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_30);
        _Var7 = std::fabs<int>(iVar4);
        local_38 = (int)((double)local_38 + _Var7);
      }
    }
    for (; lVar1 = local_30, iVar5 = TPZBaseMatrix::Cols(in_RDI), lVar1 < iVar5;
        local_30 = local_30 + 1) {
      local_34 = GetRandomVal((TPZMatrix<int> *)0x12ecda9);
      if (local_28 != local_30) {
        _Var7 = std::fabs<int>(local_34);
        local_38 = (int)((double)local_38 + _Var7);
      }
      iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                        (in_RDI,local_28,local_30,&local_34);
      if (iVar4 == 0) {
        Error(in_stack_00000180,in_stack_00000178);
      }
    }
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar5 == iVar6) {
      _Var7 = std::fabs<int>(local_38);
      iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
      _Var8 = std::fabs<int>(iVar4);
      if (_Var8 < _Var7) {
        local_40 = local_38 + 1;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_28,local_28,&local_40);
      }
      bVar3 = IsZero(local_38);
      if (bVar3) {
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
        bVar3 = IsZero(iVar4);
        if (bVar3) {
          local_44 = 1;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_28,local_28,&local_44);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}